

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void output_list_to_stdout(uint32_t *list,uint32_t n)

{
  uint in_ESI;
  long in_RDI;
  uint32_t j;
  uint local_10;
  
  printf("%u\n",(ulong)in_ESI);
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    printf("%u\n",(ulong)*(uint *)(in_RDI + (ulong)local_10 * 4));
  }
  return;
}

Assistant:

void output_list_to_stdout(uint32_t* list, uint32_t n)
{
    printf("%u\n", n);
    for (uint32_t j = 0; j < n; j++) {
        printf("%u\n", list[j]);
    }
}